

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ze_valddi.cpp
# Opt level: O2

ze_result_t
validation_layer::zeCommandListAppendEventReset
          (ze_command_list_handle_t hCommandList,ze_event_handle_t hEvent)

{
  Logger *this;
  long *plVar1;
  long lVar2;
  ze_result_t result;
  ze_result_t zVar3;
  size_t i;
  long lVar4;
  long lVar5;
  allocator local_59;
  code *local_58;
  string local_50;
  
  lVar2 = context;
  this = *(Logger **)(context + 0xd50);
  std::__cxx11::string::string
            ((string *)&local_50,"zeCommandListAppendEventReset(hCommandList, hEvent)",&local_59);
  loader::Logger::log_trace(this,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  if (*(code **)(lVar2 + 0x2b8) == (code *)0x0) {
    result = ZE_RESULT_ERROR_UNSUPPORTED_FEATURE;
  }
  else {
    lVar5 = *(long *)(lVar2 + 0xd38) - *(long *)(lVar2 + 0xd30) >> 3;
    lVar4 = 0;
    local_58 = *(code **)(lVar2 + 0x2b8);
    do {
      if (lVar5 == lVar4) {
        if ((*(char *)(lVar2 + 4) != '\x01') ||
           (result = ZEHandleLifetimeValidation::zeCommandListAppendEventResetPrologue
                               (*(ZEHandleLifetimeValidation **)(lVar2 + 0xd48),hCommandList,hEvent)
           , result == ZE_RESULT_SUCCESS)) {
          zVar3 = (*local_58)(hCommandList,hEvent);
          lVar4 = 0;
          goto LAB_0014e140;
        }
        break;
      }
      plVar1 = (long *)**(undefined8 **)(*(long *)(lVar2 + 0xd30) + lVar4 * 8);
      result = (**(code **)(*plVar1 + 0x490))(plVar1,hCommandList,hEvent);
      lVar4 = lVar4 + 1;
    } while (result == ZE_RESULT_SUCCESS);
  }
  goto LAB_0014e16d;
  while( true ) {
    plVar1 = (long *)**(undefined8 **)(*(long *)(lVar2 + 0xd30) + lVar4 * 8);
    result = (**(code **)(*plVar1 + 0x498))(plVar1,hCommandList,hEvent,zVar3);
    lVar4 = lVar4 + 1;
    if (result != ZE_RESULT_SUCCESS) break;
LAB_0014e140:
    result = zVar3;
    if (lVar5 == lVar4) break;
  }
LAB_0014e16d:
  logAndPropagateResult("zeCommandListAppendEventReset",result);
  return result;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zeCommandListAppendEventReset(
        ze_command_list_handle_t hCommandList,          ///< [in] handle of the command list
        ze_event_handle_t hEvent                        ///< [in] handle of the event
        )
    {
        context.logger->log_trace("zeCommandListAppendEventReset(hCommandList, hEvent)");

        auto pfnAppendEventReset = context.zeDdiTable.CommandList.pfnAppendEventReset;

        if( nullptr == pfnAppendEventReset )
            return logAndPropagateResult("zeCommandListAppendEventReset", ZE_RESULT_ERROR_UNSUPPORTED_FEATURE);

        auto numValHandlers = context.validationHandlers.size();
        for (size_t i = 0; i < numValHandlers; i++) {
            auto result = context.validationHandlers[i]->zeValidation->zeCommandListAppendEventResetPrologue( hCommandList, hEvent );
            if(result!=ZE_RESULT_SUCCESS) return logAndPropagateResult("zeCommandListAppendEventReset", result);
        }


        if( context.enableThreadingValidation ){ 
            //Unimplemented
        }

        
        if(context.enableHandleLifetime ){
            auto result = context.handleLifetime->zeHandleLifetime.zeCommandListAppendEventResetPrologue( hCommandList, hEvent );
            if(result!=ZE_RESULT_SUCCESS) return logAndPropagateResult("zeCommandListAppendEventReset", result);
        }

        auto driver_result = pfnAppendEventReset( hCommandList, hEvent );

        for (size_t i = 0; i < numValHandlers; i++) {
            auto result = context.validationHandlers[i]->zeValidation->zeCommandListAppendEventResetEpilogue( hCommandList, hEvent ,driver_result);
            if(result!=ZE_RESULT_SUCCESS) return logAndPropagateResult("zeCommandListAppendEventReset", result);
        }

        return logAndPropagateResult("zeCommandListAppendEventReset", driver_result);
    }